

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_move_nodes(lyd_node *parent,lyd_node **first_dst_p,lyd_node *first_src)

{
  lyd_node *local_30;
  lyd_node *first_dst;
  lyd_node *plStack_20;
  LY_ERR ret;
  lyd_node *first_src_local;
  lyd_node **first_dst_p_local;
  lyd_node *parent_local;
  
  plStack_20 = first_src;
  first_src_local = (lyd_node *)first_dst_p;
  first_dst_p_local = (lyd_node **)parent;
  if ((((parent != (lyd_node *)0x0) || (first_dst_p != (lyd_node **)0x0)) &&
      (first_src != (lyd_node *)0x0)) && (first_src->prev->next == (lyd_node *)0x0)) {
    if ((first_dst_p == (lyd_node **)0x0) || (*first_dst_p == (lyd_node *)0x0)) {
      local_30 = lyd_child(parent);
    }
    else {
      local_30 = *first_dst_p;
    }
    if (local_30 == (lyd_node *)0x0) {
      first_dst._4_4_ = lyd_move_nodes_at_once((lyd_node *)first_dst_p_local,plStack_20);
      local_30 = plStack_20;
    }
    else {
      first_dst._4_4_ = lyd_move_nodes_by_schema(&local_30,plStack_20);
    }
    if (first_src_local != (lyd_node *)0x0) {
      *(lyd_node **)first_src_local = local_30;
    }
    return first_dst._4_4_;
  }
  __assert_fail("(parent || first_dst_p) && first_src && !first_src->prev->next",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                ,0x3c4,
                "LY_ERR lyd_move_nodes(struct lyd_node *, struct lyd_node **, struct lyd_node *)");
}

Assistant:

static LY_ERR
lyd_move_nodes(struct lyd_node *parent, struct lyd_node **first_dst_p, struct lyd_node *first_src)
{
    LY_ERR ret;
    struct lyd_node *first_dst;

    assert((parent || first_dst_p) && first_src && !first_src->prev->next);

    if (!first_dst_p || !*first_dst_p) {
        first_dst = lyd_child(parent);
    } else {
        first_dst = *first_dst_p;
    }

    if (first_dst) {
        ret = lyd_move_nodes_by_schema(&first_dst, first_src);
    } else {
        ret = lyd_move_nodes_at_once(parent, first_src);
        first_dst = first_src;
    }

    if (first_dst_p) {
        *first_dst_p = first_dst;
    }

    return ret;
}